

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha3.c
# Opt level: O2

void pp_crypto_hash_sha3_process(PHashSHA3 *ctx,puint64 *data)

{
  puint64 *ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  puint64 pVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  puint i;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong local_58 [6];
  puint64 C [5];
  
  uVar12 = ctx->block_size;
  for (uVar10 = 0; uVar12 >> 3 != uVar10; uVar10 = uVar10 + 1) {
    ctx->hash[uVar10] = ctx->hash[uVar10] ^ data[uVar10];
  }
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 1) {
    for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
      C[lVar11] = ctx->hash[lVar11 + 5] ^ ctx->hash[lVar11] ^ ctx->hash[lVar11 + 10] ^
                  ctx->hash[lVar11 + 0xf] ^ ctx->hash[lVar11 + 0x14];
    }
    for (lVar11 = -5; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar10 = C[lVar11 + -1];
      ctx->hash[lVar11 + 5] = ctx->hash[lVar11 + 5] ^ uVar10;
      ctx->hash[lVar11 + 10] = ctx->hash[lVar11 + 10] ^ uVar10;
      ctx->hash[lVar11 + 0xf] = ctx->hash[lVar11 + 0xf] ^ uVar10;
      ctx->hash[lVar11 + 0x14] = ctx->hash[lVar11 + 0x14] ^ uVar10;
      *(ulong *)(&ctx->len + lVar11 * 2) = *(ulong *)(&ctx->len + lVar11 * 2) ^ uVar10;
    }
    pVar4 = ctx->hash[1];
    ctx->hash[1] = ctx->hash[6] << 0x2c | ctx->hash[6] >> 0x14;
    ctx->hash[6] = ctx->hash[9] << 0x14 | ctx->hash[9] >> 0x2c;
    ctx->hash[9] = ctx->hash[0x16] << 0x3d | ctx->hash[0x16] >> 3;
    ctx->hash[0x16] = ctx->hash[0xe] << 0x27 | ctx->hash[0xe] >> 0x19;
    ctx->hash[0xe] = ctx->hash[0x14] << 0x12 | ctx->hash[0x14] >> 0x2e;
    ctx->hash[0x14] = ctx->hash[2] << 0x3e | ctx->hash[2] >> 2;
    ctx->hash[2] = ctx->hash[0xc] << 0x2b | ctx->hash[0xc] >> 0x15;
    ctx->hash[0xc] = ctx->hash[0xd] << 0x19 | ctx->hash[0xd] >> 0x27;
    ctx->hash[0xd] = ctx->hash[0x13] << 8 | ctx->hash[0x13] >> 0x38;
    ctx->hash[0x13] = ctx->hash[0x17] << 0x38 | ctx->hash[0x17] >> 8;
    ctx->hash[0x17] = ctx->hash[0xf] << 0x29 | ctx->hash[0xf] >> 0x17;
    ctx->hash[0xf] = ctx->hash[4] << 0x1b | ctx->hash[4] >> 0x25;
    ctx->hash[4] = ctx->hash[0x18] << 0xe | ctx->hash[0x18] >> 0x32;
    ctx->hash[0x18] = ctx->hash[0x15] << 2 | ctx->hash[0x15] >> 0x3e;
    ctx->hash[0x15] = ctx->hash[8] << 0x37 | ctx->hash[8] >> 9;
    ctx->hash[8] = ctx->hash[0x10] << 0x2d | ctx->hash[0x10] >> 0x13;
    ctx->hash[0x10] = ctx->hash[5] << 0x24 | ctx->hash[5] >> 0x1c;
    ctx->hash[5] = ctx->hash[3] << 0x1c | ctx->hash[3] >> 0x24;
    ctx->hash[3] = ctx->hash[0x12] << 0x15 | ctx->hash[0x12] >> 0x2b;
    ctx->hash[0x12] = ctx->hash[0x11] << 0xf | ctx->hash[0x11] >> 0x31;
    ctx->hash[0x11] = ctx->hash[0xb] << 10 | ctx->hash[0xb] >> 0x36;
    ctx->hash[0xb] = ctx->hash[7] << 6 | ctx->hash[7] >> 0x3a;
    ctx->hash[7] = ctx->hash[10] << 3 | ctx->hash[10] >> 0x3d;
    ctx->hash[10] = pVar4 << 1 | (ulong)((long)pVar4 < 0);
    for (uVar10 = 0; uVar10 < 0x19; uVar10 = uVar10 + 5) {
      uVar5 = ctx->hash[uVar10];
      auVar2 = *(undefined1 (*) [16])(ctx->hash + uVar10 + 3);
      auVar3 = *(undefined1 (*) [16])(ctx->hash + uVar10 + 1);
      uVar12 = (uint)(uVar5 >> 0x20);
      auVar8._8_4_ = (uint)uVar5;
      auVar8._0_8_ = auVar2._8_8_;
      auVar8._12_4_ = uVar12;
      auVar7._8_4_ = auVar2._0_4_;
      auVar7._0_8_ = auVar3._8_8_;
      auVar7._12_4_ = auVar2._4_4_;
      uVar6 = ctx->hash[uVar10 + 1];
      ppVar1 = ctx->hash + uVar10;
      *(uint *)ppVar1 = ~auVar3._0_4_ & auVar3._8_4_ ^ (uint)uVar5;
      *(uint *)((long)ppVar1 + 4) = ~auVar3._4_4_ & auVar3._12_4_ ^ uVar12;
      *(uint *)(ppVar1 + 1) = ~auVar3._8_4_ & auVar2._0_4_ ^ auVar3._0_4_;
      *(uint *)((long)ppVar1 + 0xc) = ~auVar3._12_4_ & auVar2._4_4_ ^ auVar3._4_4_;
      *(undefined1 (*) [16])(ctx->hash + uVar10 + 2) = ~auVar2 & auVar8 ^ auVar7;
      ctx->hash[uVar10 + 4] = ctx->hash[uVar10 + 4] ^ ~uVar5 & uVar6;
    }
    ctx->hash[0] = ctx->hash[0] ^ pp_crypto_hash_sha3_K[lVar9];
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha3_process (PHashSHA3		*ctx,
			     const puint64	*data)
{
	puint i;
	puint qwords = ctx->block_size / 8;

	for (i = 0; i < qwords; ++i)
		ctx->hash[i] ^= data[i];

	/* Make the Keccak permutation */
	pp_crypto_hash_sha3_keccak_permutate (ctx);
}